

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::MultiCutter::
init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,DistanceType dist_type,
          vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *p,
          int max_flow_intensity,int random_seed,bool should_skip_non_maximum_sides)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer pDVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pDVar8;
  int i;
  long lVar9;
  ulong uVar10;
  DistanceAwareCutter *this_00;
  BasicCutter *this_01;
  long lVar11;
  int local_54;
  int local_50;
  DistanceType local_4c;
  PierceNodeScore *local_48;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  
  local_4c = dist_type;
  local_48 = score_pierce_node;
  while( true ) {
    pDVar8 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar5 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar6 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pDVar5 - (long)pDVar8) / 0x14c0) <= (ulong)((long)pSVar7 - (long)pSVar6 >> 3)
       ) break;
    std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ::pop_back(&this->cutter_list);
  }
  while ((ulong)(((long)pDVar5 - (long)pDVar8) / 0x14c0) < (ulong)((long)pSVar7 - (long)pSVar6 >> 3)
        ) {
    std::vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>::
    emplace_back<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&>
              ((vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>
                *)this,graph);
    pDVar8 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pDVar5 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (local_50 = 0; local_50 < (int)((ulong)((long)pSVar7 - (long)pSVar6) >> 3);
      local_50 = local_50 + 1) {
    this_00 = (this->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_start + local_50;
    my_score_pierce_node.score_pierce_node = local_48;
    my_score_pierce_node.i = &local_50;
    DistanceAwareCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>
              (this_00,graph,tmp,search_algo,local_4c,pSVar6[local_50],max_flow_intensity,
               local_50 + random_seed + 1);
    if (should_skip_non_maximum_sides) {
      while (bVar1 = DistanceAwareCutter::
                     does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::MultiCutter::init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,flow_cutter::DistanceType,std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>const&,int,int,bool)::_lambda(int,int,bool,int,int)_1_>
                               (this_00,graph,&my_score_pierce_node), !bVar1) {
        DistanceAwareCutter::
        advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::MultiCutter::init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,flow_cutter::DistanceType,std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>const&,int,int,bool)::_lambda(int,int,bool,int,int)_1_>
                  (this_00,graph,tmp,search_algo,&my_score_pierce_node);
      }
    }
    pSVar6 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_54 = -1;
  lVar11 = 0;
  uVar10 = 0x7fffffff;
  iVar2 = 0;
  for (lVar9 = 0; lVar9 < (int)((ulong)((long)pSVar7 - (long)pSVar6) >> 3); lVar9 = lVar9 + 1) {
    this_01 = (BasicCutter *)
              ((long)(((this->cutter_list).
                       super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                       ._M_impl.super__Vector_impl_data._M_start)->cutter).assimilated + lVar11);
    pvVar4 = BasicCutter::get_current_cut(this_01);
    if (((int)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2) < (int)uVar10) ||
       ((pvVar4 = BasicCutter::get_current_cut(this_01),
        (int)uVar10 ==
        (int)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2) &&
        (iVar3 = BasicCutter::get_current_smaller_cut_side_size(this_01), iVar2 < iVar3)))) {
      pvVar4 = BasicCutter::get_current_cut(this_01);
      uVar10 = (ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      iVar2 = BasicCutter::get_current_smaller_cut_side_size(this_01);
      local_54 = (int)lVar9;
    }
    pSVar6 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = lVar11 + 0x14c0;
  }
  this->current_cutter_id = local_54;
  iVar2 = BasicCutter::get_current_smaller_cut_side_size
                    (&(this->cutter_list).
                      super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_54].cutter);
  this->current_smaller_side_size = iVar2;
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node, DistanceType dist_type,
        const std::vector<SourceTargetPair>& p, int max_flow_intensity, int random_seed,
        bool should_skip_non_maximum_sides = true)
    {
        while (cutter_list.size() > p.size())
            cutter_list.pop_back(); // can not use resize because that requires
                // default constructor...
        while (cutter_list.size() < p.size())
            cutter_list.emplace_back(graph);

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            auto my_score_pierce_node = [&](int x, int side,
                                            bool causes_augmenting_path,
                                            int source_dist, int target_dist) {
                return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                    target_dist, i);
            };

            x.init(graph, tmp, search_algo, dist_type, p[i], max_flow_intensity, random_seed + 1 + i);
            if (should_skip_non_maximum_sides)
                while (!x.does_next_advance_increase_cut(graph, my_score_pierce_node))
                    x.advance(graph, tmp, search_algo, my_score_pierce_node);
        }

        int best_cutter_id = -1;
        int best_cut_size = std::numeric_limits<int>::max();
        int best_cutter_weight = 0;

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            if ((int)x.get_current_cut().size() < best_cut_size || ((int)x.get_current_cut().size() == best_cut_size && x.get_current_smaller_cut_side_size() > best_cutter_weight)) {
                best_cutter_id = i;
                best_cut_size = x.get_current_cut().size();
                best_cutter_weight = x.get_current_smaller_cut_side_size();
            }
        }

        current_cutter_id = best_cutter_id;
        current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
    }